

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O1

void dradb2(int ido,int l1,float *cc,float *ch,float *wa1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  float *pfVar6;
  float *pfVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  
  uVar12 = l1 * ido;
  iVar5 = ido * 2;
  if (0 < l1) {
    iVar10 = 0;
    pfVar7 = ch;
    iVar11 = l1;
    do {
      iVar9 = ido * 2 + -1 + iVar10;
      *pfVar7 = cc[iVar10] + cc[iVar9];
      pfVar7[(int)uVar12] = cc[iVar10] - cc[iVar9];
      pfVar7 = pfVar7 + ido;
      iVar10 = iVar10 + iVar5;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  if (1 < ido) {
    if (ido == 2) {
      if (l1 < 1) {
        return;
      }
    }
    else {
      if (0 < l1) {
        iVar10 = 0;
        iVar9 = 0;
        pfVar7 = ch;
        iVar11 = iVar5;
        uVar13 = uVar12;
        do {
          pfVar6 = cc + (long)iVar11 + -2;
          uVar8 = 2;
          do {
            pfVar7[uVar8 - 1] = cc[(long)iVar10 + (uVar8 - 1)] + pfVar6[-1];
            fVar1 = cc[(long)iVar10 + (uVar8 - 1)];
            fVar2 = pfVar6[-1];
            pfVar7[uVar8] = cc[(long)iVar10 + uVar8] - *pfVar6;
            fVar3 = cc[(long)iVar10 + uVar8];
            fVar4 = *pfVar6;
            ch[(ulong)uVar13 + (uVar8 - 1)] =
                 wa1[uVar8 - 2] * (fVar1 - fVar2) - wa1[uVar8 - 1] * (fVar3 + fVar4);
            ch[uVar13 + uVar8] = (fVar3 + fVar4) * wa1[uVar8 - 2] + (fVar1 - fVar2) * wa1[uVar8 - 1]
            ;
            uVar8 = uVar8 + 2;
            pfVar6 = pfVar6 + -2;
          } while (uVar8 < (uint)ido);
          iVar9 = iVar9 + 1;
          uVar13 = uVar13 + ido;
          iVar11 = iVar11 + iVar5;
          iVar10 = iVar10 + iVar5;
          pfVar7 = pfVar7 + (uint)ido;
        } while (iVar9 != l1);
      }
      if ((ido & 1U) != 0 || l1 < 1) {
        return;
      }
    }
    iVar11 = 1;
    if (1 < l1) {
      iVar11 = l1;
    }
    pfVar7 = ch + (ido + -1);
    pfVar6 = cc + (long)(ido + -1) + 1;
    do {
      *pfVar7 = pfVar6[-1] + pfVar6[-1];
      pfVar7[(int)uVar12] = -(*pfVar6 + *pfVar6);
      pfVar7 = pfVar7 + (uint)ido;
      pfVar6 = pfVar6 + iVar5;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  return;
}

Assistant:

static void dradb2(int ido,int l1,float *cc,float *ch,float *wa1){
  int i,k,t0,t1,t2,t3,t4,t5,t6;
  float ti2,tr2;

  t0=l1*ido;

  t1=0;
  t2=0;
  t3=(ido<<1)-1;
  for(k=0;k<l1;k++){
    ch[t1]=cc[t2]+cc[t3+t2];
    ch[t1+t0]=cc[t2]-cc[t3+t2];
    t2=(t1+=ido)<<1;
  }

  if(ido<2)return;
  if(ido==2)goto L105;

  t1=0;
  t2=0;
  for(k=0;k<l1;k++){
    t3=t1;
    t5=(t4=t2)+(ido<<1);
    t6=t0+t1;
    for(i=2;i<ido;i+=2){
      t3+=2;
      t4+=2;
      t5-=2;
      t6+=2;
      ch[t3-1]=cc[t4-1]+cc[t5-1];
      tr2=cc[t4-1]-cc[t5-1];
      ch[t3]=cc[t4]-cc[t5];
      ti2=cc[t4]+cc[t5];
      ch[t6-1]=wa1[i-2]*tr2-wa1[i-1]*ti2;
      ch[t6]=wa1[i-2]*ti2+wa1[i-1]*tr2;
    }
    t2=(t1+=ido)<<1;
  }

  if(ido%2==1)return;

L105:
  t1=ido-1;
  t2=ido-1;
  for(k=0;k<l1;k++){
    ch[t1]=cc[t2]+cc[t2];
    ch[t1+t0]=-(cc[t2+1]+cc[t2+1]);
    t1+=ido;
    t2+=ido<<1;
  }
}